

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O3

void polyscope::view::updateFlight(void)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined8 uVar6;
  bool bVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  float fVar31;
  undefined1 auVar32 [16];
  vec3 local_90;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 local_80;
  float local_7c;
  undefined4 local_78;
  undefined4 local_74;
  float local_70;
  float local_6c;
  undefined4 local_68;
  undefined4 local_64;
  float local_60;
  float local_5c;
  float local_58;
  uint local_54;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  undefined8 uStack_30;
  undefined8 uStack_28;
  undefined8 uStack_20;
  undefined8 uStack_18;
  
  if (midflight == '\x01') {
    dVar20 = ImGui::GetTime();
    if (dVar20 <= (double)flightEndTime) {
      dVar20 = ImGui::GetTime();
      auVar15._8_8_ = 0;
      auVar15._0_8_ = _DAT_005fc6f0;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = flightInitialViewR;
      auVar16._4_4_ = flightTargetViewR._4_4_;
      auVar16._0_4_ = (float)flightTargetViewR;
      auVar16._8_8_ = 0;
      auVar13._0_12_ = ZEXT812(0);
      auVar13._12_4_ = 0;
      dVar20 = (dVar20 - (double)flightStartTime) / (double)(flightEndTime - flightStartTime);
      auVar21._0_4_ = (float)dVar20;
      auVar21._4_4_ = (int)((ulong)dVar20 >> 0x20);
      auVar21._8_8_ = 0;
      auVar10 = vmaxss_avx(auVar13,auVar21);
      auVar10 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar10);
      auVar9._4_4_ = DAT_005fc6d0._4_4_;
      auVar9._0_4_ = (float)DAT_005fc6d0;
      auVar9._8_8_ = 0;
      auVar12 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar10,ZEXT416(0x40400000));
      auVar11._0_4_ = (float)_DAT_005fc6f0 * (float)DAT_005fc6d0;
      auVar11._4_4_ = (float)(_DAT_005fc6f0 >> 0x20) * DAT_005fc6d0._4_4_;
      auVar11._8_8_ = 0;
      auVar9 = vmovshdup_avx(auVar9);
      auVar11 = vshufps_avx(auVar11,auVar11,0xe1);
      fVar28 = auVar10._0_4_ * auVar10._0_4_ * auVar12._0_4_;
      auVar10._0_4_ = (float)flightTargetViewR * (float)flightInitialViewR + auVar11._0_4_;
      auVar10._4_4_ = flightTargetViewR._4_4_ * (float)(flightInitialViewR >> 0x20) + auVar11._4_4_;
      auVar10._8_4_ = auVar11._8_4_ + 0.0;
      auVar10._12_4_ = auVar11._12_4_ + 0.0;
      auVar10 = vhaddps_avx(auVar10,auVar10);
      auVar22._8_4_ = 0x80000000;
      auVar22._0_8_ = 0x8000000080000000;
      auVar22._12_4_ = 0x80000000;
      uVar6 = vcmpss_avx512f(auVar10,auVar13,1);
      bVar7 = (bool)((byte)uVar6 & 1);
      fVar25 = 1.0 - fVar28;
      auVar10 = vmovshdup_avx(auVar14);
      fVar8 = (float)((uint)bVar7 * (int)-fVar28 + (uint)!bVar7 * (int)fVar28);
      auVar11 = vmovshdup_avx(auVar15);
      fVar24 = fVar25 * (float)_DAT_005fc6f0 + (float)DAT_005fc6d0 * fVar8;
      fVar26 = auVar9._0_4_ * fVar8 + fVar25 * auVar11._0_4_;
      fVar23 = fVar25 * (float)flightInitialViewR + (float)flightTargetViewR * fVar8;
      auVar9 = vmovshdup_avx(auVar16);
      fVar1 = fVar25 * auVar10._0_4_ + auVar9._0_4_ * fVar8;
      fVar2 = fVar25 * DAT_005fc704 + fVar8 * DAT_005fc6e4;
      local_90.field_2.z = fVar25 * DAT_005fc71c + fVar28 * DAT_005fc710;
      fVar3 = fVar25 * DAT_005fc6f8 + fVar8 * DAT_005fc6d8;
      fVar27 = fVar25 * DAT_005fc6fc + fVar8 * DAT_005fc6dc;
      fVar8 = fVar25 * DAT_005fc700 + fVar8 * DAT_005fc6e0;
      auVar12._0_4_ = fVar25 * (float)flightInitialViewT + (float)flightTargetViewT * fVar28;
      auVar12._4_4_ =
           fVar25 * (float)((ulong)flightInitialViewT >> 0x20) +
           (float)((ulong)flightTargetViewT >> 0x20) * fVar28;
      auVar12._8_4_ = fVar25 * 0.0 + fVar28 * 0.0;
      auVar12._12_4_ = fVar25 * 0.0 + fVar28 * 0.0;
      local_90._0_8_ = vmovlps_avx(auVar12);
      auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar1)),ZEXT416((uint)fVar23),
                                ZEXT416((uint)fVar23));
      auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)fVar24),ZEXT416((uint)fVar24));
      auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)fVar26),ZEXT416((uint)fVar26));
      fVar25 = auVar10._0_4_;
      fVar28 = fVar26 / fVar25;
      fVar29 = fVar23 / fVar25;
      fVar31 = fVar1 / fVar25;
      fVar25 = fVar24 / fVar25;
      fVar26 = fVar26 * fVar28;
      local_58 = fVar31 * fVar1;
      fVar4 = fVar24 * fVar25;
      fVar28 = fVar28 + fVar28;
      fVar25 = fVar25 + fVar25;
      fVar5 = fVar23 * fVar29;
      fVar29 = fVar29 + fVar29;
      auVar10 = vmulss_avx512f(ZEXT416((uint)fVar28),ZEXT416((uint)fVar3));
      auVar9 = vmulss_avx512f(ZEXT416((uint)fVar25),ZEXT416((uint)fVar3));
      auVar11 = vmulss_avx512f(ZEXT416((uint)fVar1),ZEXT416((uint)fVar29));
      auVar12 = vmulss_avx512f(ZEXT416((uint)fVar24),ZEXT416((uint)fVar29));
      auVar32 = ZEXT416((uint)(fVar31 + fVar31));
      auVar13 = vmulss_avx512f(ZEXT416((uint)fVar24),auVar32);
      auVar14 = vaddss_avx512f(ZEXT416((uint)fVar26),ZEXT416((uint)fVar5));
      auVar30 = ZEXT416((uint)fVar29);
      auVar15 = vfmsub231ss_avx512f(auVar10,ZEXT416((uint)fVar2),auVar30);
      auVar9 = vfmsub231ss_avx512f(auVar9,ZEXT416((uint)fVar2),auVar32);
      auVar10 = vfmadd231ss_fma(ZEXT416((uint)((fVar31 + fVar31) * fVar3)),ZEXT416((uint)fVar2),
                                ZEXT416((uint)fVar25));
      auVar16 = vsubss_avx512f(auVar11,ZEXT416((uint)(fVar28 * fVar24)));
      auVar11 = vaddss_avx512f(auVar11,ZEXT416((uint)(fVar28 * fVar24)));
      auVar17 = vaddss_avx512f(ZEXT416((uint)fVar26),ZEXT416((uint)local_58));
      auVar14 = vsubss_avx512f(auVar14,ZEXT416((uint)local_58));
      auVar18 = vaddss_avx512f(auVar12,ZEXT416((uint)(fVar28 * fVar1)));
      auVar19 = vsubss_avx512f(auVar13,ZEXT416((uint)(fVar23 * fVar28)));
      auVar12 = vsubss_avx512f(auVar12,ZEXT416((uint)(fVar28 * fVar1)));
      auVar13 = vaddss_avx512f(auVar13,ZEXT416((uint)(fVar23 * fVar28)));
      auVar17 = vsubss_avx512f(auVar17,ZEXT416((uint)fVar5));
      auVar14 = vsubss_avx512f(auVar14,ZEXT416((uint)fVar4));
      auVar15 = vfmadd231ss_avx512f(auVar15,ZEXT416((uint)fVar27),ZEXT416((uint)fVar25));
      auVar9 = vfnmadd231ss_avx512f(auVar9,ZEXT416((uint)fVar27),ZEXT416((uint)fVar28));
      auVar10 = vfnmadd231ss_fma(auVar10,ZEXT416((uint)fVar27),auVar30);
      auVar17 = vsubss_avx512f(auVar17,ZEXT416((uint)fVar4));
      local_58 = ((fVar26 + fVar4) - fVar5) - local_58;
      local_80 = auVar14._0_4_;
      local_7c = auVar16._0_4_;
      local_78 = auVar18._0_4_;
      auVar14 = vfnmadd231ss_avx512f(auVar15,ZEXT416((uint)fVar8),auVar32);
      auVar9 = vfmadd231ss_avx512f(auVar9,ZEXT416((uint)fVar8),auVar30);
      auVar10 = vfnmadd231ss_fma(auVar10,ZEXT416((uint)fVar8),ZEXT416((uint)fVar28));
      auVar14 = vxorps_avx512vl(auVar14,auVar22);
      auVar9 = vxorps_avx512vl(auVar9,auVar22);
      local_54 = auVar10._0_4_ ^ 0x80000000;
      local_74 = auVar14._0_4_;
      local_70 = auVar11._0_4_;
      local_6c = auVar17._0_4_;
      local_68 = auVar19._0_4_;
      local_64 = auVar9._0_4_;
      local_60 = auVar12._0_4_;
      local_5c = auVar13._0_4_;
      buildTransform((mat3x4 *)&local_80,&local_90);
      viewMat = local_50;
      _DAT_005fc68c = uStack_48;
      DAT_005fc694 = uStack_40;
      _DAT_005fc69c = uStack_38;
      DAT_005fc6a4 = uStack_30;
      DAT_005fc6ac = uStack_28;
      DAT_005fc6b4 = uStack_20;
      DAT_005fc6bc = uStack_18;
      auVar10 = vfmadd231ss_fma(ZEXT416((uint)(auVar21._0_4_ * flightTargetFov)),
                                ZEXT416((uint)(1.0 - auVar21._0_4_)),ZEXT416(flightInitialFov));
      fVar24 = auVar10._0_4_;
    }
    else {
      auVar9 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      midflight = '\0';
      auVar10 = vfmadd231ss_fma(ZEXT416((uint)(flightTargetViewR._4_4_ * flightTargetViewR._4_4_)),
                                ZEXT416((uint)(float)flightTargetViewR),
                                ZEXT416((uint)(float)flightTargetViewR));
      auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)(float)DAT_005fc6d0),
                                ZEXT416((uint)(float)DAT_005fc6d0));
      auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)DAT_005fc6d0._4_4_),
                                ZEXT416((uint)DAT_005fc6d0._4_4_));
      fVar23 = auVar10._0_4_;
      fVar24 = DAT_005fc6d0._4_4_ / fVar23;
      fVar26 = (float)flightTargetViewR / fVar23;
      fVar27 = flightTargetViewR._4_4_ / fVar23;
      fVar23 = (float)DAT_005fc6d0 / fVar23;
      fVar1 = DAT_005fc6d0._4_4_ * fVar24;
      fVar24 = fVar24 + fVar24;
      fVar2 = (float)flightTargetViewR * fVar26;
      fVar26 = fVar26 + fVar26;
      fVar3 = (float)DAT_005fc6d0 * fVar23;
      fVar23 = fVar23 + fVar23;
      local_58 = flightTargetViewR._4_4_ * fVar27;
      auVar10 = vmulss_avx512f(ZEXT416((uint)fVar24),ZEXT416((uint)DAT_005fc6d8));
      auVar11 = vmulss_avx512f(ZEXT416((uint)fVar23),ZEXT416((uint)DAT_005fc6d8));
      local_5c = (float)DAT_005fc6d0 * (fVar27 + fVar27);
      auVar14 = ZEXT416((uint)fVar26);
      auVar10 = vfmsub231ss_avx512f(auVar10,ZEXT416((uint)DAT_005fc6e4),auVar14);
      auVar15 = ZEXT416((uint)(fVar27 + fVar27));
      auVar11 = vfmsub231ss_avx512f(auVar11,ZEXT416((uint)DAT_005fc6e4),auVar15);
      local_7c = flightTargetViewR._4_4_ * fVar26 - (float)DAT_005fc6d0 * fVar24;
      local_70 = flightTargetViewR._4_4_ * fVar26 + (float)DAT_005fc6d0 * fVar24;
      auVar12 = vaddss_avx512f(ZEXT416((uint)((float)DAT_005fc6d0 * fVar26)),
                               ZEXT416((uint)(flightTargetViewR._4_4_ * fVar24)));
      auVar13 = vsubss_avx512f(ZEXT416((uint)local_5c),
                               ZEXT416((uint)((float)flightTargetViewR * fVar24)));
      local_60 = (float)DAT_005fc6d0 * fVar26 - flightTargetViewR._4_4_ * fVar24;
      local_5c = local_5c + (float)flightTargetViewR * fVar24;
      local_80.x = ((fVar2 + fVar1) - local_58) - fVar3;
      auVar10 = vfmadd231ss_avx512f(auVar10,ZEXT416((uint)DAT_005fc6dc),ZEXT416((uint)fVar23));
      auVar11 = vfnmadd231ss_avx512f(auVar11,ZEXT416((uint)DAT_005fc6dc),ZEXT416((uint)fVar24));
      local_6c = ((local_58 + fVar1) - fVar2) - fVar3;
      local_58 = ((fVar3 + fVar1) - fVar2) - local_58;
      local_78 = auVar12._0_4_;
      auVar10 = vfnmadd231ss_avx512f(auVar10,ZEXT416((uint)DAT_005fc6e0),auVar15);
      auVar12 = vmulss_avx512f(ZEXT416((uint)DAT_005fc6d8),auVar15);
      auVar11 = vfmadd231ss_avx512f(auVar11,ZEXT416((uint)DAT_005fc6e0),auVar14);
      auVar12 = vfmadd231ss_avx512f(auVar12,ZEXT416((uint)DAT_005fc6e4),ZEXT416((uint)fVar23));
      auVar10 = vxorps_avx512vl(auVar10,auVar9);
      auVar11 = vxorps_avx512vl(auVar11,auVar9);
      local_74 = auVar10._0_4_;
      local_68 = auVar13._0_4_;
      local_64 = auVar11._0_4_;
      auVar10 = vfnmadd231ss_avx512f(auVar12,ZEXT416((uint)DAT_005fc6dc),auVar14);
      auVar10 = vfnmadd231ss_avx512f(auVar10,ZEXT416((uint)DAT_005fc6e0),ZEXT416((uint)fVar24));
      auVar10 = vxorps_avx512vl(auVar10,auVar9);
      local_54 = auVar10._0_4_;
      buildTransform((mat3x4 *)&local_80,(vec3 *)&flightTargetViewT);
      viewMat = local_50;
      _DAT_005fc68c = uStack_48;
      DAT_005fc694 = uStack_40;
      _DAT_005fc69c = uStack_38;
      DAT_005fc6a4 = uStack_30;
      DAT_005fc6ac = uStack_28;
      DAT_005fc6b4 = uStack_20;
      DAT_005fc6bc = uStack_18;
      fVar24 = flightTargetFov;
    }
    fov = (double)fVar24;
    requestRedraw();
  }
  return;
}

Assistant:

void updateFlight() {
  if (midflight) {
    if (ImGui::GetTime() > flightEndTime) {
      // Flight is over, ensure we end exactly at target location
      midflight = false;
      viewMat = buildTransform(glm::mat3x4_cast(flightTargetViewR), flightTargetViewT);
      fov = flightTargetFov;
    } else {
      // normalized time for spline on [0,1]
      float t = (ImGui::GetTime() - flightStartTime) / (flightEndTime - flightStartTime);

      float tSmooth = glm::smoothstep(0.f, 1.f, t);

      // linear spline
      glm::dualquat interpR = glm::lerp(flightInitialViewR, flightTargetViewR, tSmooth);

      glm::vec3 interpT = glm::mix(flightInitialViewT, flightTargetViewT, tSmooth);

      viewMat = buildTransform(glm::mat3x4_cast(interpR), interpT);

      // linear spline
      fov = (1.0f - t) * flightInitialFov + t * flightTargetFov;
    }
    requestRedraw(); // flight is still happening, draw again next frame
  }
}